

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster<bool,_void>::load
          (type_caster<bool,_void> *this,handle src,bool param_2)

{
  bool bVar1;
  PyObject **ppPVar2;
  bool param_2_local;
  type_caster<bool,_void> *this_local;
  handle src_local;
  
  this_local = (type_caster<bool,_void> *)src.m_ptr;
  bVar1 = handle::operator_cast_to_bool((handle *)&this_local);
  if (bVar1) {
    ppPVar2 = handle::ptr((handle *)&this_local);
    if (*ppPVar2 == (PyObject *)&_Py_TrueStruct) {
      this->value = true;
      src_local.m_ptr._7_1_ = true;
    }
    else {
      ppPVar2 = handle::ptr((handle *)&this_local);
      if (*ppPVar2 == (PyObject *)&_Py_FalseStruct) {
        this->value = false;
        src_local.m_ptr._7_1_ = true;
      }
      else {
        src_local.m_ptr._7_1_ = false;
      }
    }
  }
  else {
    src_local.m_ptr._7_1_ = false;
  }
  return src_local.m_ptr._7_1_;
}

Assistant:

bool load(handle src, bool) {
        if (!src) return false;
        else if (src.ptr() == Py_True) { value = true; return true; }
        else if (src.ptr() == Py_False) { value = false; return true; }
        else return false;
    }